

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int multi_getsock(Curl_easy *data,curl_socket_t *socks,int numsocks)

{
  int numsocks_local;
  curl_socket_t *socks_local;
  Curl_easy *data_local;
  
  if (data->conn == (connectdata *)0x0) {
    data_local._4_4_ = 0;
  }
  else {
    if ((CURLM_STATE_CONNECT < data->mstate) && (data->mstate < CURLM_STATE_COMPLETED)) {
      data->conn->data = data;
    }
    switch(data->mstate) {
    case CURLM_STATE_WAITRESOLVE:
      data_local._4_4_ = Curl_resolv_getsock(data->conn,socks,numsocks);
      break;
    case CURLM_STATE_WAITCONNECT:
      data_local._4_4_ = waitconnect_getsock(data->conn,socks,numsocks);
      break;
    case CURLM_STATE_WAITPROXYCONNECT:
      data_local._4_4_ = waitproxyconnect_getsock(data->conn,socks,numsocks);
      break;
    case CURLM_STATE_SENDPROTOCONNECT:
    case CURLM_STATE_PROTOCONNECT:
      data_local._4_4_ = Curl_protocol_getsock(data->conn,socks,numsocks);
      break;
    case CURLM_STATE_DO:
    case CURLM_STATE_DOING:
      data_local._4_4_ = Curl_doing_getsock(data->conn,socks,numsocks);
      break;
    case CURLM_STATE_DO_MORE:
      data_local._4_4_ = domore_getsock(data->conn,socks,numsocks);
      break;
    case CURLM_STATE_DO_DONE:
    case CURLM_STATE_PERFORM:
      data_local._4_4_ = Curl_single_getsock(data->conn,socks,numsocks);
      break;
    default:
      data_local._4_4_ = 0;
    }
  }
  return data_local._4_4_;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks, /* points to numsocks number
                                                  of sockets */
                         int numsocks)
{
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  if(!data->conn)
    return 0;

  if(data->mstate > CURLM_STATE_CONNECT &&
     data->mstate < CURLM_STATE_COMPLETED) {
    /* Set up ownership correctly */
    data->conn->data = data;
  }

  switch(data->mstate) {
  default:
#if 0 /* switch back on these cases to get the compiler to check for all enums
         to be present */
  case CURLM_STATE_TOOFAST:  /* returns 0, so will not select. */
  case CURLM_STATE_COMPLETED:
  case CURLM_STATE_MSGSENT:
  case CURLM_STATE_INIT:
  case CURLM_STATE_CONNECT:
  case CURLM_STATE_WAITDO:
  case CURLM_STATE_DONE:
  case CURLM_STATE_LAST:
    /* this will get called with CURLM_STATE_COMPLETED when a handle is
       removed */
#endif
    return 0;

  case CURLM_STATE_WAITRESOLVE:
    return Curl_resolv_getsock(data->conn, socks, numsocks);

  case CURLM_STATE_PROTOCONNECT:
  case CURLM_STATE_SENDPROTOCONNECT:
    return Curl_protocol_getsock(data->conn, socks, numsocks);

  case CURLM_STATE_DO:
  case CURLM_STATE_DOING:
    return Curl_doing_getsock(data->conn, socks, numsocks);

  case CURLM_STATE_WAITPROXYCONNECT:
    return waitproxyconnect_getsock(data->conn, socks, numsocks);

  case CURLM_STATE_WAITCONNECT:
    return waitconnect_getsock(data->conn, socks, numsocks);

  case CURLM_STATE_DO_MORE:
    return domore_getsock(data->conn, socks, numsocks);

  case CURLM_STATE_DO_DONE: /* since is set after DO is completed, we switch
                               to waiting for the same as the *PERFORM
                               states */
  case CURLM_STATE_PERFORM:
    return Curl_single_getsock(data->conn, socks, numsocks);
  }

}